

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_tests.cpp
# Opt level: O2

void __thiscall PerformanceTest::long_test(PerformanceTest *this)

{
  long lVar1;
  time_t tVar2;
  ostream *poVar3;
  int iVar4;
  uint64_t key;
  string local_250;
  ofstream os;
  
  lVar1 = time((time_t *)0x0);
  std::ofstream::ofstream(&os,"long_test.txt",_S_out);
  iVar4 = 0;
  for (key = 0; key != 10000000; key = key + 1) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_250,'\x10');
    KVStore::put(&(this->super_Test).store,key,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    iVar4 = iVar4 + 1;
    tVar2 = time((time_t *)0x0);
    if (tVar2 - lVar1 == 1) {
      poVar3 = std::ostream::_M_insert<long>((long)&os);
      poVar3 = std::operator<<(poVar3,' ');
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
      std::operator<<(poVar3,'\n');
      iVar4 = 0;
      lVar1 = tVar2;
    }
  }
  std::ofstream::~ofstream(&os);
  return;
}

Assistant:

void long_test() {
        auto max = 10000000;
        auto put_ps = 0;
        auto start_time = time(nullptr);
        auto cur_time = start_time;
        auto new_time = start_time;
        auto os = std::ofstream{"long_test.txt"};
        for (int i = 0; i < max; i++) {
            store.put(i, std::string(10000, 's'));
            put_ps++;
            new_time = time(nullptr);
            if (new_time - cur_time == 1) {
                os << new_time - start_time << ' ' << put_ps << '\n';
                put_ps = 0;
                cur_time = new_time;
            }
        }
    }